

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

bool __thiscall Expr::ConstFold(Expr *this,Env *env,int *pn)

{
  bool bVar1;
  
  if (this->expr_type_ == EXPR_ID) {
    bVar1 = Env::GetConstant(env,this->id_,pn);
    return bVar1;
  }
  if (this->expr_type_ == EXPR_NUM) {
    *pn = this->num_->n;
    return true;
  }
  return false;
}

Assistant:

bool Expr::ConstFold(Env* env, int* pn) const
	{
	switch ( expr_type_ )
		{
		case EXPR_NUM:
			*pn = num_->Num();
			return true;
		case EXPR_ID:
			return env->GetConstant(id_, pn);
		default:
			// ### FIXME: folding consts
			return false;
		}
	}